

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

int linsolve_wiener(int n,int64_t *A,int stride,int64_t *b,int64_t *x)

{
  undefined1 auVar1 [16];
  int64_t iVar2;
  long lVar3;
  sbyte sVar4;
  uint uVar5;
  int64_t *piVar6;
  ulong uVar7;
  int64_t *piVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int64_t *piVar12;
  sbyte sVar13;
  uint uVar14;
  ulong uVar15;
  int j_2;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  int64_t *local_88;
  
  uVar5 = n - 1;
  uVar21 = 0;
  if (0 < n) {
    uVar21 = (ulong)(uint)n;
  }
  uVar7 = (ulong)n;
  lVar19 = (long)stride;
  uVar10 = 0;
  if (0 < (int)uVar5) {
    uVar10 = (ulong)uVar5;
  }
  local_88 = A + lVar19;
  uVar18 = 0;
  piVar12 = A;
  do {
    piVar6 = A + (uVar7 - 1) * lVar19;
    piVar8 = A + (uVar7 - 2) * lVar19;
    lVar22 = uVar7 - 1;
    if (uVar18 == uVar10) {
      uVar14 = stride * uVar5;
      while( true ) {
        uVar7 = uVar7 - 1;
        uVar20 = (uint)uVar7;
        uVar21 = uVar7 & 0xffffffff;
        if (((int)uVar20 < 0) || (A[uVar20 * stride + uVar20] == 0)) break;
        lVar19 = 0;
        for (lVar22 = 0; (int)((int)lVar22 + uVar20) < (int)uVar5; lVar22 = lVar22 + 1) {
          lVar19 = lVar19 + (x[uVar21 + lVar22 + 1] * A[(ulong)uVar14 + uVar21 + lVar22 + 1]) /
                            0x10000;
        }
        x[uVar21] = ((b[uVar21] - lVar19) * 0x10000) / A[uVar20 * stride + uVar20];
        uVar14 = uVar14 - stride;
      }
      return uVar20 >> 0x1f;
    }
    while ((long)uVar18 < lVar22) {
      lVar9 = lVar22 + -1;
      uVar15 = A[uVar18 + lVar9 * lVar19];
      uVar17 = -uVar15;
      if (0 < (long)uVar15) {
        uVar17 = uVar15;
      }
      uVar15 = A[uVar18 + lVar22 * lVar19];
      uVar16 = -uVar15;
      if (0 < (long)uVar15) {
        uVar16 = uVar15;
      }
      if (uVar17 < uVar16) {
        for (uVar15 = 0; uVar21 != uVar15; uVar15 = uVar15 + 1) {
          iVar2 = piVar6[uVar15];
          piVar6[uVar15] = piVar8[uVar15];
          piVar8[uVar15] = iVar2;
        }
        auVar1 = *(undefined1 (*) [16])(b + lVar9);
        auVar23._0_8_ = auVar1._8_8_;
        auVar23._8_4_ = auVar1._0_4_;
        auVar23._12_4_ = auVar1._4_4_;
        *(undefined1 (*) [16])(b + lVar9) = auVar23;
      }
      piVar6 = piVar6 + -lVar19;
      piVar8 = piVar8 + -lVar19;
      lVar22 = lVar9;
    }
    lVar22 = 0;
    for (uVar15 = 0; uVar21 != uVar15; uVar15 = uVar15 + 1) {
      lVar9 = piVar12[uVar15];
      lVar11 = -lVar9;
      if (0 < lVar9) {
        lVar11 = lVar9;
      }
      if (lVar22 < lVar11) {
        lVar22 = lVar11;
      }
    }
    lVar9 = 0x80;
    if (lVar22 < 0x400000) {
      lVar9 = 1;
    }
    lVar11 = 0x40;
    if (lVar22 < 0x400000) {
      lVar11 = 1;
    }
    sVar13 = 0xd;
    if (lVar22 < 0x400000) {
      sVar13 = 0;
    }
    piVar6 = local_88;
    uVar15 = uVar18;
    sVar4 = 7;
    if (lVar22 < 0x400000) {
      sVar4 = 0;
    }
    while (uVar15 != uVar5) {
      lVar22 = A[(uint)((stride + 1) * (int)uVar18)];
      if (lVar22 == 0) {
        return 0;
      }
      uVar15 = uVar15 + 1;
      lVar3 = A[uVar18 + uVar15 * lVar19];
      for (uVar17 = 0; uVar21 != uVar17; uVar17 = uVar17 + 1) {
        piVar6[uVar17] =
             piVar6[uVar17] - (((piVar12[uVar17] / lVar11) * (lVar3 / lVar9)) / lVar22 << sVar13);
      }
      b[uVar15] = b[uVar15] - ((b[uVar18] * (lVar3 / lVar9)) / lVar22 << sVar4);
      piVar6 = piVar6 + lVar19;
    }
    uVar18 = uVar18 + 1;
    piVar12 = piVar12 + lVar19;
    local_88 = local_88 + lVar19;
  } while( true );
}

Assistant:

static int linsolve_wiener(int n, int64_t *A, int stride, int64_t *b,
                           int64_t *x) {
  for (int k = 0; k < n - 1; k++) {
    // Partial pivoting: bring the row with the largest pivot to the top
    for (int i = n - 1; i > k; i--) {
      // If row i has a better (bigger) pivot than row (i-1), swap them
      if (llabs(A[(i - 1) * stride + k]) < llabs(A[i * stride + k])) {
        for (int j = 0; j < n; j++) {
          const int64_t c = A[i * stride + j];
          A[i * stride + j] = A[(i - 1) * stride + j];
          A[(i - 1) * stride + j] = c;
        }
        const int64_t c = b[i];
        b[i] = b[i - 1];
        b[i - 1] = c;
      }
    }

    // b/278065963: The multiplies
    //   c / 256 * A[k * stride + j] / cd * 256
    // and
    //   c / 256 * b[k] / cd * 256
    // within Gaussian elimination can cause a signed integer overflow. Rework
    // the multiplies so that larger scaling is used without significantly
    // impacting the overall precision.
    //
    // Precision guidance:
    //   scale_threshold: Pick as high as possible.
    // For max_abs_akj >= scale_threshold scenario:
    //   scaler_A: Pick as low as possible. Needed for A[(i + 1) * stride + j].
    //   scaler_c: Pick as low as possible while maintaining scaler_c >=
    //     (1 << 7). Needed for A[(i + 1) * stride + j] and b[i + 1].
    int64_t max_abs_akj = 0;
    for (int j = 0; j < n; j++) {
      const int64_t abs_akj = llabs(A[k * stride + j]);
      if (abs_akj > max_abs_akj) max_abs_akj = abs_akj;
    }
    const int scale_threshold = 1 << 22;
    const int scaler_A = max_abs_akj < scale_threshold ? 1 : (1 << 6);
    const int scaler_c = max_abs_akj < scale_threshold ? 1 : (1 << 7);
    const int scaler = scaler_c * scaler_A;

    // Forward elimination (convert A to row-echelon form)
    for (int i = k; i < n - 1; i++) {
      if (A[k * stride + k] == 0) return 0;
      const int64_t c = A[(i + 1) * stride + k] / scaler_c;
      const int64_t cd = A[k * stride + k];
      for (int j = 0; j < n; j++) {
        A[(i + 1) * stride + j] -=
            A[k * stride + j] / scaler_A * c / cd * scaler;
      }
      b[i + 1] -= c * b[k] / cd * scaler_c;
    }
  }
  // Back-substitution
  for (int i = n - 1; i >= 0; i--) {
    if (A[i * stride + i] == 0) return 0;
    int64_t c = 0;
    for (int j = i + 1; j <= n - 1; j++) {
      c += A[i * stride + j] * x[j] / WIENER_TAP_SCALE_FACTOR;
    }
    // Store filter taps x in scaled form.
    x[i] = WIENER_TAP_SCALE_FACTOR * (b[i] - c) / A[i * stride + i];
  }

  return 1;
}